

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::LogDestination::SetLogSymlink(LogSeverity severity,char *symlink_basename)

{
  char *pcVar1;
  mutex *__mutex;
  LogSeverity severity_00;
  int iVar2;
  LogDestination *pLVar3;
  _Head_base<0UL,_google::LogDestination_*,_false> _Var4;
  ulong uVar5;
  pointer __p;
  LogSeverity local_98 [2];
  __uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> local_90 [2]
  ;
  LogMessageFatal local_80;
  
  local_80.super_LogMessage.allocated_._0_4_ = 0;
  local_98[0] = severity;
  if (((int)severity < 0) &&
     (_Var4._M_head_impl =
           (LogDestination *)
           MakeCheckOpString<google::LogSeverity,int>(local_98,(int *)&local_80,"severity >= 0"),
     (_Head_base<0UL,_google::LogDestination_*,_false>)_Var4._M_head_impl !=
     (_Head_base<0UL,_google::LogDestination_*,_false>)0x0)) {
    local_90[0]._M_t.
    super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>.
    super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl =
         (tuple<google::LogDestination_*,_std::default_delete<google::LogDestination>_>)
         (tuple<google::LogDestination_*,_std::default_delete<google::LogDestination>_>)
         _Var4._M_head_impl;
    LogMessageFatal::LogMessageFatal
              (&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
               ,0x290,(CheckOpString *)local_90);
    LogMessageFatal::~LogMessageFatal(&local_80);
  }
  local_98[1] = 4;
  if (3 < (int)local_98[0]) {
    SetLogSymlink();
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)log_mutex);
  severity_00 = local_98[0];
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  uVar5 = (ulong)local_98[0];
  pLVar3 = (LogDestination *)(&log_destinations_)[uVar5];
  if (pLVar3 == (LogDestination *)0x0) {
    pLVar3 = (LogDestination *)operator_new(0xd0);
    LogDestination(pLVar3,severity_00,(char *)0x0);
    local_90[0]._M_t.
    super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>.
    super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl =
         (tuple<google::LogDestination_*,_std::default_delete<google::LogDestination>_>)
         (_Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>)
         0x0;
    std::__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_>::
    reset((__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> *)
          (&log_destinations_ + uVar5),pLVar3);
    std::unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>::
    ~unique_ptr((unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> *)
                local_90);
    pLVar3 = (((__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_>
                *)(&log_destinations_ + uVar5))->_M_t).
             super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
             .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl;
  }
  __mutex = &(pLVar3->fileobject_).mutex_;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  pcVar1 = (char *)(pLVar3->fileobject_).symlink_basename_._M_string_length;
  strlen(symlink_basename);
  std::__cxx11::string::_M_replace
            ((ulong)&(pLVar3->fileobject_).symlink_basename_,0,pcVar1,(ulong)symlink_basename);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  pthread_mutex_unlock((pthread_mutex_t *)log_mutex);
  return;
}

Assistant:

inline void LogDestination::SetLogSymlink(LogSeverity severity,
                                          const char* symlink_basename) {
  CHECK_GE(severity, 0);
  CHECK_LT(severity, NUM_SEVERITIES);
  std::lock_guard<std::mutex> l{log_mutex};
  log_destination(severity)->fileobject_.SetSymlinkBasename(symlink_basename);
}